

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candump.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined8 uVar7;
  int iVar8;
  undefined4 uVar9;
  uint uVar10;
  undefined7 uVar20;
  int *piVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  void *__optval;
  long lVar15;
  char **ppcVar16;
  ulong uVar17;
  int *piVar18;
  cmsghdr *__cmsg;
  time_t tVar19;
  bool bVar21;
  uint uVar22;
  char (*pacVar23) [19];
  byte *pbVar24;
  size_t sVar25;
  __u32 frames;
  uint uVar26;
  ulong uVar27;
  char (*__dest) [17];
  long lVar28;
  epoll_data_t eVar29;
  char **ppcVar30;
  ulong uVar31;
  int iVar32;
  size_t sStack_360;
  uint local_33c;
  uint local_338;
  int local_334;
  int rcvbuf_size;
  epoll_data_t local_328;
  char **local_320;
  uint local_318;
  int local_314;
  byte *local_310;
  FILE *local_308;
  int local_300;
  int local_2fc;
  can_err_mask_t err_mask;
  int join_filter;
  ulong local_2f0;
  undefined4 local_2e8;
  undefined4 local_2e4;
  undefined8 local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined8 local_2c8;
  long local_2c0;
  can_raw_vcid_options vcid_opts;
  epoll_event event_setup;
  timeval tv;
  sockaddr local_288;
  undefined8 local_278;
  msghdr msg;
  timeval local_238;
  ifreq ifr;
  iovec iov;
  char local_1f0 [16];
  int local_1e0;
  epoll_event events_pending [16];
  char ctrlmsg [120];
  char fname [83];
  
  event_setup.data.u64._4_4_ = 0;
  rcvbuf_size = 0;
  event_setup.events = 1;
  event_setup.data.fd = 0;
  local_288.sa_family = 0x1d;
  local_288.sa_data[0] = '\0';
  local_288.sa_data[1] = '\0';
  local_288.sa_data[2] = '\0';
  local_288.sa_data[3] = '\0';
  local_288.sa_data[4] = '\0';
  local_288.sa_data[5] = '\0';
  local_288.sa_data[6] = '\0';
  local_288.sa_data[7] = '\0';
  local_288.sa_data[8] = '\0';
  local_288.sa_data[9] = '\0';
  local_288.sa_data[10] = '\0';
  local_288.sa_data[0xb] = '\0';
  local_288.sa_data[0xc] = '\0';
  local_288.sa_data[0xd] = '\0';
  local_278 = 0;
  vcid_opts.flags = '\x04';
  vcid_opts.tx_vcid = '\0';
  vcid_opts.rx_vcid = '\0';
  vcid_opts.rx_vcid_mask = '\0';
  signal(0xf,sigterm);
  signal(1,sigterm);
  signal(2,sigterm);
  local_238.tv_sec = 0;
  local_238.tv_usec = 0;
  progname = __xpg_basename(*argv);
  uVar20 = (undefined7)((ulong)progname >> 8);
  local_2e4 = (undefined4)CONCAT71(uVar20,0x61);
  local_2e8 = (undefined4)CONCAT71(uVar20,1);
  local_2c0 = -1;
  local_33c = 0xffffff2a;
  uVar27 = 0;
  bVar5 = false;
  bVar6 = false;
  local_2fc = 0;
  local_2e0 = 0;
  local_2c8 = 0;
  local_310 = (byte *)0x0;
  local_308 = (FILE *)0x0;
  local_318 = 0;
  local_320 = argv;
  bVar21 = false;
LAB_001024c3:
  do {
    bVar4 = bVar21;
    iVar8 = getopt(argc,argv,"t:HciaSs:lf:Ln:r:Dde8xT:h?");
    uVar20 = (undefined7)
             ((ulong)((long)&switchD_001024e5::switchdataD_00106020 +
                     (long)(int)(&switchD_001024e5::switchdataD_00106020)[iVar8 - 0x61]) >> 8);
    bVar21 = bVar4;
    switch(iVar8) {
    case 0x61:
      uVar27 = uVar27 | 1;
      break;
    case 0x62:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x75:
    case 0x76:
    case 0x77:
      goto switchD_001024e5_caseD_62;
    case 99:
      local_2e0 = CONCAT71((int7)((ulong)local_2e0 >> 8),(char)local_2e0 + '\x01');
      break;
    case 100:
      local_308 = (FILE *)CONCAT71(uVar20,1);
      break;
    case 0x65:
      uVar27 = uVar27 | 8;
      break;
    case 0x66:
      local_310 = _optarg;
    case 0x6c:
      bVar5 = true;
      break;
    case 0x69:
      uVar27 = uVar27 | 2;
      break;
    case 0x6e:
      iVar8 = atoi((char *)_optarg);
      local_2fc = iVar8;
      goto LAB_0010264c;
    case 0x72:
      iVar8 = atoi((char *)_optarg);
      rcvbuf_size = iVar8;
LAB_0010264c:
      if (iVar8 < 1) goto switchD_001024e5_caseD_62;
      break;
    case 0x73:
      local_33c = atoi((char *)_optarg);
      if (2 < (local_33c & 0xff)) goto switchD_001024e5_caseD_62;
      break;
    case 0x74:
      bVar2 = *_optarg;
      local_318 = (uint)bVar2;
      if ((0x39 < bVar2 - 0x41) || ((0x200000900000001U >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0)
         ) {
        local_318 = 0;
        fprintf(_stderr,"%s: unknown timestamp mode \'%c\' - ignored\n",progname,
                (ulong)(uint)(int)(char)bVar2);
      }
      local_2e4 = 0x61;
      argv = local_320;
      if (bVar2 == 0x7a) {
        local_2e4 = 0x7a;
      }
      break;
    case 0x78:
      local_2c8 = CONCAT71(uVar20,1);
      break;
    default:
      if (iVar8 == 0x38) {
        uVar27 = uVar27 | 0x20;
      }
      else if (iVar8 == 0x44) {
        local_2e8 = 0;
      }
      else {
        bVar21 = true;
        if (iVar8 != 0x48) {
          if (iVar8 == 0x4c) {
            bVar6 = true;
            bVar21 = bVar4;
          }
          else {
            if (iVar8 != 0x53) {
              if (iVar8 == 0x54) goto code_r0x00102524;
              if (iVar8 == -1) {
                if (_optind == argc) {
                  print_usage();
                }
                else {
                  if ((char)uVar27 == '\0' || !bVar6) {
                    bVar21 = bVar6;
                    if (local_310 != (byte *)0x0 && bVar5) {
                      uVar22 = *local_310 - 0x2d;
                      if (uVar22 == 0) {
                        uVar22 = (uint)local_310[1];
                      }
                      if (uVar22 == 0) {
                        bVar5 = false;
                      }
                      bVar21 = true;
                      if (uVar22 != 0) {
                        bVar21 = bVar6;
                      }
                    }
                    if ((char)local_33c == '*') {
                      if (bVar5) {
                        fwrite("Disabled standard output while logging.\n",0x28,1,_stderr);
                        local_33c = 2;
                      }
                      else {
                        local_33c = 0;
                      }
                    }
                    uVar22 = argc - _optind;
                    if (0x10 < (int)uVar22) {
                      fprintf(_stderr,"More than %d CAN devices given on commandline!\n",0x10);
                      return 1;
                    }
                    local_300 = epoll_create(1);
                    if (local_300 < 0) {
                      pcVar12 = "epoll_create";
                      goto LAB_00103721;
                    }
                    local_2d8 = (char *)CONCAT71(local_2d8._1_7_,
                                                 ((char)local_318 != '\0' || bVar5) || bVar21);
                    pcVar12 = (char *)0x0;
                    if (0 < (int)uVar22) {
                      pcVar12 = (char *)(ulong)uVar22;
                    }
                    pcVar14 = (char *)0x0;
                    local_2f0 = uVar27;
                    goto LAB_001027b0;
                  }
                  fwrite("Log file format selected: Please disable ASCII/BINARY/SWAP/RAWDLC options!\n"
                         ,0x4b,1,_stderr);
                }
                exit(0);
              }
              goto switchD_001024e5_caseD_62;
            }
            uVar27 = uVar27 | 4;
            bVar21 = bVar4;
          }
        }
      }
    }
  } while( true );
code_r0x00102524:
  piVar11 = __errno_location();
  *piVar11 = 0;
  local_2c0 = strtol((char *)_optarg,(char **)0x0,0);
  argv = local_320;
  bVar21 = bVar4;
  if (*piVar11 != 0) goto switchD_001024e5_caseD_62;
  goto LAB_001024c3;
LAB_001027b0:
  if (pcVar14 == pcVar12) {
    if (bVar5) {
      if (local_310 == (byte *)0x0) {
        tVar19 = time((time_t *)ctrlmsg);
        if (tVar19 == -1) {
          pcVar12 = "time";
          goto LAB_00103721;
        }
        localtime_r((time_t *)ctrlmsg,(tm *)events_pending);
        local_310 = (byte *)fname;
        snprintf((char *)local_310,0x53,"candump-%04d-%02d-%02d_%02d%02d%02d.log",
                 (ulong)(events_pending[1].data.u64._4_4_ + 0x76c),
                 (ulong)(events_pending[1].data.fd + 1),(ulong)events_pending[1].events,
                 (ulong)(uint)events_pending[0].data._4_4_,(ulong)(uint)events_pending[0].data._0_4_
                 ,(ulong)events_pending[0].events);
      }
      if ((char)local_33c != '\x02') {
        fwrite("Warning: Console output active while logging!\n",0x2e,1,_stderr);
      }
      pbVar24 = local_310;
      fprintf(_stderr,"Enabling Logfile \'%s\'\n",local_310);
      local_308 = fopen((char *)pbVar24,"w");
      if (local_308 == (FILE *)0x0) {
        pcVar12 = "logfile";
        goto LAB_00103721;
      }
    }
    else {
      local_308 = (FILE *)0x0;
    }
    msg.msg_iov = &iov;
    iov.iov_base = &main::cu;
    msg.msg_name = &local_288;
    msg.msg_iovlen = 1;
    msg.msg_control = ctrlmsg;
    bVar21 = (char)local_33c == '\0' && bVar21;
    local_310 = (byte *)CONCAT44(local_310._4_4_,(int)local_2e0 + -1);
    local_2d0 = "\x1b[0m";
    local_2d8 = "";
    if ((byte)local_2e0 == 1) {
      local_2d8 = "\x1b[0m";
    }
    if ((byte)local_2e0 < 2) {
      local_2d0 = "";
    }
    local_314 = CONCAT31(local_314._1_3_,bVar21);
    local_328.fd._0_1_ = bVar5 || bVar21;
    local_338 = 0;
    goto LAB_00102d1c;
  }
  pbVar24 = (byte *)argv[(long)(int)pcVar14 + (long)_optind];
  pcVar13 = strchr((char *)pbVar24,0x2c);
  iVar8 = socket(0x1d,3,1);
  sock_info[(long)pcVar14].s = iVar8;
  if (iVar8 < 0) {
    pcVar12 = "socket";
    goto LAB_00103721;
  }
  eVar29.ptr = sock_info + (long)pcVar14;
  event_setup.data.ptr = eVar29.ptr;
  iVar8 = epoll_ctl(local_300,1,iVar8,(epoll_event *)&event_setup);
  if (iVar8 != 0) {
    pcVar12 = "failed to add socket to epoll";
    goto LAB_00103721;
  }
  sock_info[(long)pcVar14].cmdlinename = (char *)pbVar24;
  if (pcVar13 == (char *)0x0) {
    sVar25 = strlen((char *)pbVar24);
    iVar8 = (int)sVar25;
  }
  else {
    iVar8 = (int)pcVar13 - (int)pbVar24;
  }
  if (0xf < iVar8) {
    pcVar12 = "name of CAN device \'%s\' is too long!\n";
LAB_00103505:
    fprintf(_stderr,pcVar12,pbVar24);
    return 1;
  }
  if (max_devname_len < iVar8) {
    max_devname_len = iVar8;
  }
  ifr.ifr_ifrn._0_8_ = 0;
  ifr.ifr_ifrn._8_8_ = 0;
  strncpy((char *)&ifr,(char *)pbVar24,(long)iVar8);
  argv = local_320;
  uVar9 = 0;
  if (ifr.ifr_ifrn._0_4_ != 0x796e61) {
    iVar8 = ioctl(*eVar29.ptr,0x8933,&ifr);
    uVar9 = ifr.ifr_ifru.ifru_ivalue;
    if (iVar8 < 0) {
      perror("SIOCGIFINDEX");
      goto LAB_001037a2;
    }
  }
  local_288.sa_data._2_4_ = uVar9;
  local_328.ptr = eVar29.ptr;
  local_2d0 = pcVar14;
  if (pcVar13 != (char *)0x0) {
    sVar25 = 0;
    pcVar14 = pcVar13;
    while (pcVar14 != (char *)0x0) {
      pcVar14 = strchr(pcVar14 + 1,0x2c);
      sVar25 = sVar25 + 8;
    }
    __optval = malloc(sVar25);
    if (__optval == (void *)0x0) {
      pcVar12 = "Failed to create filter space!\n";
      sStack_360 = 0x1f;
LAB_00103775:
      fwrite(pcVar12,sStack_360,1,_stderr);
      return 1;
    }
    err_mask = 0;
    join_filter = 0;
    local_314 = 0;
LAB_0010290c:
    lVar15 = (long)local_314;
    puVar1 = (uint *)((long)__optval + lVar15 * 8);
    lVar28 = (long)__optval + lVar15 * 8 + 4;
    pcVar14 = pcVar13;
    while (eVar29 = local_328, pcVar14 != (char *)0x0) {
      pbVar24 = (byte *)(pcVar14 + 1);
      pcVar13 = strchr((char *)pbVar24,0x2c);
      iVar8 = __isoc99_sscanf(pbVar24,"%x:%x",puVar1,lVar28);
      if (iVar8 == 2) {
        pbVar24 = (byte *)((long)__optval + lVar15 * 8 + 7);
        *pbVar24 = *pbVar24 & 0xdf;
        if (pcVar14[9] == ':') {
          *(byte *)((long)puVar1 + 3) = *(byte *)((long)puVar1 + 3) | 0x80;
        }
        goto LAB_001029e9;
      }
      iVar8 = __isoc99_sscanf(pbVar24,"%x~%x",puVar1,lVar28);
      if (iVar8 == 2) goto LAB_001029c3;
      pcVar14 = pcVar13;
      if ((*pbVar24 | 0x20) == 0x6a) {
        join_filter = 1;
      }
      else {
        iVar8 = __isoc99_sscanf(pbVar24,"#%x",&err_mask);
        if (iVar8 != 1) {
          pcVar12 = "Error in filter option parsing: \'%s\'\n";
          goto LAB_00103505;
        }
      }
    }
    if (err_mask != 0) {
      setsockopt(*local_328.ptr,0x65,2,&err_mask,4);
    }
    if (join_filter != 0) {
      iVar8 = setsockopt(*eVar29.ptr,0x65,6,&join_filter,4);
      if (iVar8 < 0) {
        pcVar12 = "setsockopt CAN_RAW_JOIN_FILTERS not supported by your Linux Kernel";
        goto LAB_00103721;
      }
    }
    if (local_314 != 0) {
      setsockopt(*eVar29.ptr,0x65,1,__optval,local_314 << 3);
    }
    free(__optval);
    argv = local_320;
  }
  setsockopt(*eVar29.ptr,0x65,5,&canfx_on,4);
  setsockopt(*eVar29.ptr,0x65,7,&canfx_on,4);
  setsockopt(*eVar29.ptr,0x65,8,&vcid_opts,4);
  pcVar14 = local_2d0;
  uVar27 = local_2f0;
  if (rcvbuf_size != 0) {
    ctrlmsg[0] = '\x04';
    ctrlmsg[1] = '\0';
    ctrlmsg[2] = '\0';
    ctrlmsg[3] = '\0';
    iVar8 = setsockopt(*local_328.ptr,1,0x21,&rcvbuf_size,4);
    eVar29 = local_328;
    if (iVar8 < 0) {
      iVar8 = setsockopt(*local_328.ptr,1,8,&rcvbuf_size,4);
      if (iVar8 < 0) {
        pcVar12 = "setsockopt SO_RCVBUF";
        goto LAB_00103721;
      }
      iVar8 = getsockopt(*eVar29.ptr,1,8,events_pending,(socklen_t *)ctrlmsg);
      if (iVar8 < 0) {
        pcVar12 = "getsockopt SO_RCVBUF";
        goto LAB_00103721;
      }
      if ((pcVar14 == (char *)0x0) && ((int)events_pending[0].events < rcvbuf_size * 2)) {
        fwrite("The socket receive buffer size was adjusted due to /proc/sys/net/core/rmem_max.\n",
               0x50,1,_stderr);
      }
    }
  }
  if ((char)local_2d8 != '\0') {
    if (bVar4) {
      events_pending[0].events = 0x58;
      iVar8 = setsockopt(*local_328.ptr,1,0x25,events_pending,4);
      if (iVar8 < 0) {
        pcVar12 = "setsockopt SO_TIMESTAMPING is not supported by your Linux kernel";
        goto LAB_00103721;
      }
    }
    else {
      events_pending[0].events = 1;
      iVar8 = setsockopt(*local_328.ptr,1,0x1d,events_pending,4);
      if (iVar8 < 0) {
        pcVar12 = "setsockopt SO_TIMESTAMP";
        goto LAB_00103721;
      }
    }
  }
  if ((char)local_308 != '\0') {
    events_pending[0].events = 1;
    iVar8 = setsockopt(*local_328.ptr,1,0x28,events_pending,4);
    if (iVar8 < 0) {
      pcVar12 = "setsockopt SO_RXQ_OVFL not supported by your Linux Kernel";
      goto LAB_00103721;
    }
  }
  iVar8 = bind(*local_328.ptr,&local_288,0x18);
  pcVar14 = pcVar14 + 1;
  if (iVar8 < 0) {
    pcVar12 = "bind";
LAB_00103721:
    perror(pcVar12);
    return 1;
  }
  goto LAB_001027b0;
LAB_00102d1c:
  do {
    if (running == 0) {
      for (lVar15 = 0; (long)pcVar12 * 0x18 - lVar15 != 0; lVar15 = lVar15 + 0x18) {
        close(*(int *)((long)&sock_info[0].s + lVar15));
      }
      close(local_300);
      if (bVar5) {
        fclose(local_308);
      }
      if (signal_num == 0) {
        local_334 = 0;
      }
      else {
        local_334 = signal_num + 0x80;
      }
      return local_334;
    }
    uVar10 = epoll_wait(local_300,(epoll_event *)events_pending,uVar22,(int)local_2c0);
    if (uVar10 == 0xffffffff) break;
    ppcVar30 = (char **)(ulong)uVar10;
    if ((uVar10 == 0) && (-1 < (int)local_2c0)) goto LAB_0010348d;
    if ((int)uVar10 < 1) {
      ppcVar30 = (char **)0x0;
    }
    local_320 = ppcVar30;
    for (ppcVar16 = (char **)0x0; ppcVar16 != ppcVar30; ppcVar16 = (char **)((long)ppcVar16 + 1)) {
      piVar11 = (int *)events_pending[(long)ppcVar16].data.ptr;
      iov.iov_len = 0x810;
      msg.msg_namelen = 0x18;
      msg.msg_controllen = 0x78;
      msg.msg_flags = 0;
      local_2f0 = uVar27;
      uVar17 = recvmsg(*piVar11,(msghdr *)&msg,0);
      uVar9 = local_288.sa_data._2_4_;
      iVar8 = *piVar11;
      piVar18 = dindex;
      for (uVar31 = 0; uVar31 != 0x1e; uVar31 = uVar31 + 1) {
        uVar27 = local_2f0;
        if (*piVar18 == local_288.sa_data._2_4_) goto LAB_00102ec9;
        piVar18 = piVar18 + 1;
      }
      for (lVar15 = 0; uVar7 = local_288._0_8_, lVar15 != 0x78; lVar15 = lVar15 + 4) {
        if (*(int *)((long)dindex + lVar15) != 0) {
          local_1e0 = *(int *)((long)dindex + lVar15);
          iVar32 = ioctl(iVar8,0x8910,local_1f0);
          if (iVar32 < 0) {
            *(undefined4 *)((long)dindex + lVar15) = 0;
          }
        }
      }
      piVar18 = dindex;
      __dest = devname;
      uVar31 = 0;
      while( true ) {
        if (uVar31 == 0x1e) {
          fprintf(_stderr,"Interface index cache only supports %d interfaces.\n",0x1e);
          goto LAB_001037a2;
        }
        if (*piVar18 == 0) break;
        uVar31 = uVar31 + 1;
        __dest = __dest + 1;
        piVar18 = piVar18 + 1;
      }
      *piVar18 = uVar9;
      local_288.sa_data[2] = (char)uVar9;
      local_288.sa_data[3] = SUB41(uVar9,1);
      local_288.sa_data[4] = SUB41(uVar9,2);
      local_288.sa_data[5] = SUB41(uVar9,3);
      local_1e0._0_1_ = local_288.sa_data[2];
      local_1e0._1_1_ = local_288.sa_data[3];
      local_1e0._2_1_ = local_288.sa_data[4];
      local_1e0._3_1_ = local_288.sa_data[5];
      local_288._0_8_ = uVar7;
      iVar8 = ioctl(iVar8,0x8910,local_1f0);
      if (iVar8 < 0) {
        perror("SIOCGIFNAME");
      }
      iVar8 = max_devname_len;
      sVar25 = strlen(local_1f0);
      uVar27 = local_2f0;
      if (iVar8 < (int)sVar25) {
        max_devname_len = (int)sVar25;
      }
      strcpy(*__dest,local_1f0);
LAB_00102ec9:
      uVar10 = (uint)uVar17;
      iVar8 = (int)uVar31;
      if ((int)uVar10 < 0) {
        piVar11 = __errno_location();
        if ((*piVar11 != 100) || ((char)local_2e8 != '\0')) {
          pcVar12 = "read";
          goto LAB_00103721;
        }
        fprintf(_stderr,"%s: interface down\n",devname + iVar8);
        ppcVar30 = local_320;
      }
      else {
        if (uVar10 < 0xd) {
          pcVar12 = "read: no CAN frame\n";
          sStack_360 = 0x13;
          goto LAB_00103775;
        }
        if ((char)main::cu.fd.len < '\0') {
          if (main::cu.xl.len + 0xc != uVar10) {
            printf("nbytes = %d\n",uVar17 & 0xffffffff);
            pcVar12 = "read: no CAN XL frame\n";
            sStack_360 = 0x16;
            goto LAB_00103775;
          }
        }
        else if ((uVar10 & 0x7fffffff) == 0x10) {
          main::cu.cc.__pad = '\0';
        }
        else {
          if ((uVar10 & 0x7fffffff) != 0x48) {
            pcVar12 = "read: incomplete CAN CC/FD frame\n";
            sStack_360 = 0x21;
            goto LAB_00103775;
          }
          main::cu.cc.__pad = main::cu.cc.__pad | 4;
        }
        if (local_2fc == 0) {
          iVar32 = 0;
        }
        else {
          iVar32 = local_2fc + -1;
          if (iVar32 == 0) {
            running = 0;
            iVar32 = 0;
          }
        }
        __cmsg = (cmsghdr *)msg.msg_control;
        if (msg.msg_controllen < 0x10) {
          __cmsg = (cmsghdr *)0x0;
        }
        while ((__cmsg != (cmsghdr *)0x0 && (__cmsg->cmsg_level == 1))) {
          iVar3 = __cmsg->cmsg_type;
          if (iVar3 == 0x28) {
            piVar11[4] = (int)__cmsg[1].cmsg_len;
          }
          else if (iVar3 == 0x25) {
            tv.tv_sec = __cmsg[3].cmsg_len;
            tv.tv_usec = *(long *)&__cmsg[3].cmsg_level / 1000;
          }
          else if (iVar3 == 0x1d) {
            tv.tv_sec = __cmsg[1].cmsg_len;
            tv.tv_usec._0_4_ = __cmsg[1].cmsg_level;
            tv.tv_usec._4_4_ = __cmsg[1].cmsg_type;
          }
          __cmsg = __cmsg_nxthdr((msghdr *)&msg,__cmsg);
        }
        uVar10 = piVar11[4];
        uVar26 = uVar10 - piVar11[5];
        if (uVar26 != 0) {
          if ((char)local_33c != '\x02') {
            pcVar14 = "";
            if (1 < uVar26) {
              pcVar14 = "s";
            }
            printf("DROPCOUNT: dropped %u CAN frame%s on \'%s\' socket (total drops %u)\n",
                   (ulong)uVar26,pcVar14,devname + iVar8,(ulong)uVar10);
            uVar10 = piVar11[4];
          }
          if (bVar5) {
            pcVar14 = "";
            if (1 < uVar26) {
              pcVar14 = "s";
            }
            fprintf(local_308,
                    "DROPCOUNT: dropped %u CAN frame%s on \'%s\' socket (total drops %u)\n",
                    (ulong)uVar26,pcVar14,devname + iVar8);
            uVar10 = piVar11[4];
          }
          piVar11[5] = uVar10;
        }
        uVar27 = (ulong)(byte)((byte)local_2f0 | 0x10);
        if (-1 < (int)main::cu.cc.can_id) {
          uVar27 = local_2f0 & 0xff;
        }
        pcVar14 = " T";
        if ((msg.msg_flags & 4U) == 0) {
          pcVar14 = " R";
        }
        if ((char)local_2c8 == '\0') {
          pcVar14 = "";
        }
        local_2fc = iVar32;
        if (local_328._0_1_ != '\0') {
          main::alen = sprint_timestamp(main::afrbuf,(char)local_2e4,&tv,&local_238);
          iVar32 = sprintf(main::afrbuf + (uint)main::alen,"%*s ",(ulong)(uint)max_devname_len,
                           devname + iVar8);
          lVar15 = (long)iVar32 + (long)main::alen;
          main::alen = (int)lVar15;
          iVar32 = snprintf_canframe(main::afrbuf + lVar15,0x189c - lVar15,&main::cu,0);
          main::alen = main::alen + iVar32;
          if (bVar5) {
            fprintf(local_308,"%s%s\n",main::afrbuf,pcVar14);
          }
        }
        ppcVar30 = local_320;
        if ((char)local_314 == '\0') {
          if ((char)local_33c == '\0') {
            pacVar23 = (char (*) [19])0x10658a;
            if (2 < (byte)local_2e0) {
              pacVar23 = col_on + (int)((long)((ulong)(uint)(iVar8 >> 0x1f) << 0x20 |
                                              uVar31 & 0xffffffff) % 6);
            }
            main::alen = sprintf(main::afrbuf," %s",pacVar23);
            iVar32 = sprint_timestamp(main::afrbuf + main::alen,(char)local_318,&tv,&local_238);
            lVar15 = (long)main::alen;
            main::alen = (int)(iVar32 + lVar15);
            pacVar23 = (char (*) [19])0x10658a;
            if ((byte)local_310 < 2) {
              pacVar23 = col_on + (int)((long)((ulong)(uint)(iVar8 >> 0x1f) << 0x20 |
                                              uVar31 & 0xffffffff) % 6);
            }
            iVar8 = sprintf(main::afrbuf + iVar32 + lVar15," %s%*s",pacVar23,
                            (ulong)(uint)max_devname_len,devname + iVar8);
            uVar17 = (long)iVar8 + (long)main::alen;
            main::alen = (int)uVar17;
            if ((char)local_2c8 != '\0') {
              pcVar14 = "  TX %s";
              if ((msg.msg_flags & 4U) == 0) {
                pcVar14 = "  RX %s";
              }
              iVar8 = sprintf(main::afrbuf + uVar17,pcVar14,extra_m_info + (main::cu.cc.__pad & 3));
              main::alen = iVar8 + main::alen;
              uVar17 = (ulong)(uint)main::alen;
            }
            iVar8 = sprintf(main::afrbuf + (int)uVar17,"%s  ",local_2d8);
            lVar15 = (long)iVar8 + (long)main::alen;
            main::alen = (int)lVar15;
            iVar8 = snprintf_long_canframe
                              (main::afrbuf + lVar15,0x189c - lVar15,&main::cu,(int)uVar27);
            lVar15 = (long)iVar8 + (long)main::alen;
            iVar8 = (int)lVar15;
            main::alen = iVar8;
            if (((uVar27 & 8) != 0) && ((main::cu.cc.can_id & 0x20000000) != 0)) {
              main::afrbuf[lVar15 + 2] = '\0';
              (main::afrbuf + lVar15)[0] = '\n';
              (main::afrbuf + lVar15)[1] = '\t';
              main::alen = iVar8 + 2;
              iVar8 = snprintf_can_error_frame
                                (main::afrbuf + (long)iVar8 + 2,0x189a - (long)iVar8,&main::cu.fd,
                                 "\n\t");
              main::alen = main::alen + iVar8;
            }
            printf("%s%s\n",main::afrbuf,local_2d0);
            ppcVar30 = local_320;
          }
          else if ((local_33c & 0xff) == 1) {
            printf("%c\b",(ulong)(uint)(int)"|/-\\"[local_338 & 3]);
            local_338 = (local_338 & 3) + 1;
          }
        }
        else {
          printf("%s%s\n",main::afrbuf,pcVar14);
          ppcVar30 = local_320;
        }
        fflush(_stdout);
      }
    }
  } while( true );
  piVar11 = __errno_location();
  if (*piVar11 != 4) {
LAB_0010348d:
    running = 0;
  }
  goto LAB_00102d1c;
LAB_001029c3:
  uVar10 = *puVar1;
  *puVar1 = uVar10 | 0x20000000;
  *(byte *)((long)puVar1 + 7) = *(byte *)((long)puVar1 + 7) & 0xdf;
  if (pcVar14[9] == '~') {
    *puVar1 = uVar10 | 0xa0000000;
  }
LAB_001029e9:
  local_314 = local_314 + 1;
  goto LAB_0010290c;
switchD_001024e5_caseD_62:
  print_usage();
LAB_001037a2:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	int fd_epoll;
	struct epoll_event events_pending[MAXSOCK];
	struct epoll_event event_setup = {
		.events = EPOLLIN, /* prepare the common part */
	};
	unsigned char timestamp = 0;
	unsigned char logtimestamp = 'a';
	unsigned char hwtimestamp = 0;
	unsigned char down_causes_exit = 1;
	unsigned char dropmonitor = 0;
	unsigned char extra_msg_info = 0;
	unsigned char silent = SILENT_INI;
	unsigned char silentani = 0;
	unsigned char color = 0;
	unsigned char view = 0;
	unsigned char log = 0;
	unsigned char logfrmt = 0;
	int count = 0;
	int rcvbuf_size = 0;
	int opt, num_events;
	int currmax, numfilter;
	int join_filter;
	char *ptr, *nptr;
	struct sockaddr_can addr = {
		.can_family = AF_CAN,
	};
	struct can_raw_vcid_options vcid_opts = {
		.flags = CAN_RAW_XL_VCID_RX_FILTER,
		.rx_vcid = 0,
		.rx_vcid_mask = 0,
	};
	char ctrlmsg[CMSG_SPACE(sizeof(struct timeval)) +
		     CMSG_SPACE(3 * sizeof(struct timespec)) +
		     CMSG_SPACE(sizeof(__u32))];
	struct iovec iov;
	struct msghdr msg;
	struct cmsghdr *cmsg;
	struct can_filter *rfilter;
	can_err_mask_t err_mask;
	static cu_t cu; /* union for CAN CC/FD/XL frames */
	int nbytes, i;
	struct ifreq ifr;
	struct timeval tv, last_tv;
	int timeout_ms = -1; /* default to no timeout */
	FILE *logfile = NULL;
	char fname[83]; /* suggested by -Wformat-overflow= */
	const char *logname = NULL;
	static char afrbuf[AFRSZ]; /* ASCII CAN frame buffer size */
	static int alen;

	signal(SIGTERM, sigterm);
	signal(SIGHUP, sigterm);
	signal(SIGINT, sigterm);

	last_tv.tv_sec = 0;
	last_tv.tv_usec = 0;

	progname = basename(argv[0]);

	while ((opt = getopt(argc, argv, "t:HciaSs:lf:Ln:r:Dde8xT:h?")) != -1) {
		switch (opt) {
		case 't':
			timestamp = optarg[0];
			logtimestamp = optarg[0];
			if ((timestamp != 'a') && (timestamp != 'A') &&
			    (timestamp != 'd') && (timestamp != 'z')) {
				fprintf(stderr, "%s: unknown timestamp mode '%c' - ignored\n",
					progname, optarg[0]);
				timestamp = 0;
			}
			if ((logtimestamp != 'a') && (logtimestamp != 'z')) {
				logtimestamp = 'a';
			}
			break;

		case 'H':
			hwtimestamp = 1;
			break;

		case 'c':
			color++;
			break;

		case 'i':
			view |= CANLIB_VIEW_BINARY;
			break;

		case 'a':
			view |= CANLIB_VIEW_ASCII;
			break;

		case 'S':
			view |= CANLIB_VIEW_SWAP;
			break;

		case 'e':
			view |= CANLIB_VIEW_ERROR;
			break;

		case '8':
			view |= CANLIB_VIEW_LEN8_DLC;
			break;

		case 's':
			silent = atoi(optarg);
			if (silent > SILENT_ON) {
				print_usage();
				exit(1);
			}
			break;

		case 'l':
			log = 1;
			break;

		case 'D':
			down_causes_exit = 0;
			break;

		case 'd':
			dropmonitor = 1;
			break;

		case 'x':
			extra_msg_info = 1;
			break;

		case 'L':
			logfrmt = 1;
			break;

		case 'f':
			logname = optarg;
			log = 1;
			break;

		case 'n':
			count = atoi(optarg);
			if (count < 1) {
				print_usage();
				exit(1);
			}
			break;

		case 'r':
			rcvbuf_size = atoi(optarg);
			if (rcvbuf_size < 1) {
				print_usage();
				exit(1);
			}
			break;

		case 'T':
			errno = 0;
			timeout_ms = strtol(optarg, NULL, 0);
			if (errno != 0) {
				print_usage();
				exit(1);
			}
			break;
		default:
			print_usage();
			exit(1);
			break;
		}
	}

	if (optind == argc) {
		print_usage();
		exit(0);
	}

	if (logfrmt && view) {
		fprintf(stderr, "Log file format selected: Please disable ASCII/BINARY/SWAP/RAWDLC options!\n");
		exit(0);
	}

	/* "-f -"  is equal to "-L" (print logfile format on stdout) */
	if (log && logname && strcmp("-", logname) == 0) {
		log = 0; /* no logging into a file */
		logfrmt = 1; /* print logformat output to stdout */
	}

	if (silent == SILENT_INI) {
		if (log) {
			fprintf(stderr, "Disabled standard output while logging.\n");
			silent = SILENT_ON; /* disable output on stdout */
		} else
			silent = SILENT_OFF; /* default output */
	}

	currmax = argc - optind; /* find real number of CAN devices */

	if (currmax > MAXSOCK) {
		fprintf(stderr, "More than %d CAN devices given on commandline!\n", MAXSOCK);
		return 1;
	}

	fd_epoll = epoll_create(1);
	if (fd_epoll < 0) {
		perror("epoll_create");
		return 1;
	}

	for (i = 0; i < currmax; i++) {
		struct if_info *obj = &sock_info[i];
		ptr = argv[optind + i];
		nptr = strchr(ptr, ',');

		pr_debug("open %d '%s'.\n", i, ptr);

		obj->s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
		if (obj->s < 0) {
			perror("socket");
			return 1;
		}

		event_setup.data.ptr = obj; /* remember the instance as private data */
		if (epoll_ctl(fd_epoll, EPOLL_CTL_ADD, obj->s, &event_setup)) {
			perror("failed to add socket to epoll");
			return 1;
		}

		obj->cmdlinename = ptr; /* save pointer to cmdline name of this socket */

		if (nptr)
			nbytes = nptr - ptr; /* interface name is up the first ',' */
		else
			nbytes = strlen(ptr); /* no ',' found => no filter definitions */

		if (nbytes >= IFNAMSIZ) {
			fprintf(stderr, "name of CAN device '%s' is too long!\n", ptr);
			return 1;
		}

		if (nbytes > max_devname_len)
			max_devname_len = nbytes; /* for nice printing */

		memset(&ifr.ifr_name, 0, sizeof(ifr.ifr_name));
		strncpy(ifr.ifr_name, ptr, nbytes);

		pr_debug("using interface name '%s'.\n", ifr.ifr_name);

		if (strcmp(ANYDEV, ifr.ifr_name) != 0) {
			if (ioctl(obj->s, SIOCGIFINDEX, &ifr) < 0) {
				perror("SIOCGIFINDEX");
				exit(1);
			}
			addr.can_ifindex = ifr.ifr_ifindex;
		} else
			addr.can_ifindex = 0; /* any can interface */

		if (nptr) {
			/* found a ',' after the interface name => check for filters */

			/* determine number of filters to alloc the filter space */
			numfilter = 0;
			ptr = nptr;
			while (ptr) {
				numfilter++;
				ptr++; /* hop behind the ',' */
				ptr = strchr(ptr, ','); /* exit condition */
			}

			rfilter = malloc(sizeof(struct can_filter) * numfilter);
			if (!rfilter) {
				fprintf(stderr, "Failed to create filter space!\n");
				return 1;
			}

			numfilter = 0;
			err_mask = 0;
			join_filter = 0;

			while (nptr) {

				ptr = nptr + 1; /* hop behind the ',' */
				nptr = strchr(ptr, ','); /* update exit condition */

				if (sscanf(ptr, "%x:%x",
					   &rfilter[numfilter].can_id,
					   &rfilter[numfilter].can_mask) == 2) {
					rfilter[numfilter].can_mask &= ~CAN_ERR_FLAG;
					if (*(ptr + 8) == ':')
						rfilter[numfilter].can_id |= CAN_EFF_FLAG;
					numfilter++;
				} else if (sscanf(ptr, "%x~%x",
						  &rfilter[numfilter].can_id,
						  &rfilter[numfilter].can_mask) == 2) {
					rfilter[numfilter].can_id |= CAN_INV_FILTER;
					rfilter[numfilter].can_mask &= ~CAN_ERR_FLAG;
					if (*(ptr + 8) == '~')
						rfilter[numfilter].can_id |= CAN_EFF_FLAG;
					numfilter++;
				} else if (*ptr == 'j' || *ptr == 'J') {
					join_filter = 1;
				} else if (sscanf(ptr, "#%x", &err_mask) != 1) {
					fprintf(stderr, "Error in filter option parsing: '%s'\n", ptr);
					return 1;
				}
			}

			if (err_mask)
				setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_ERR_FILTER,
					   &err_mask, sizeof(err_mask));

			if (join_filter && setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_JOIN_FILTERS,
						      &join_filter, sizeof(join_filter)) < 0) {
				perror("setsockopt CAN_RAW_JOIN_FILTERS not supported by your Linux Kernel");
				return 1;
			}

			if (numfilter)
				setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_FILTER,
					   rfilter, numfilter * sizeof(struct can_filter));

			free(rfilter);

		} /* if (nptr) */

		/* try to switch the socket into CAN FD mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &canfx_on, sizeof(canfx_on));

		/* try to switch the socket into CAN XL mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_XL_FRAMES, &canfx_on, sizeof(canfx_on));

		/* try to enable the CAN XL VCID pass through mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_XL_VCID_OPTS, &vcid_opts, sizeof(vcid_opts));

		if (rcvbuf_size) {
			int curr_rcvbuf_size;
			socklen_t curr_rcvbuf_size_len = sizeof(curr_rcvbuf_size);

			/* try SO_RCVBUFFORCE first, if we run with CAP_NET_ADMIN */
			if (setsockopt(obj->s, SOL_SOCKET, SO_RCVBUFFORCE,
				       &rcvbuf_size, sizeof(rcvbuf_size)) < 0) {
				pr_debug("SO_RCVBUFFORCE failed so try SO_RCVBUF ...\n");
				if (setsockopt(obj->s, SOL_SOCKET, SO_RCVBUF,
					       &rcvbuf_size, sizeof(rcvbuf_size)) < 0) {
					perror("setsockopt SO_RCVBUF");
					return 1;
				}

				if (getsockopt(obj->s, SOL_SOCKET, SO_RCVBUF,
					       &curr_rcvbuf_size, &curr_rcvbuf_size_len) < 0) {
					perror("getsockopt SO_RCVBUF");
					return 1;
				}

				/* Only print a warning the first time we detect the adjustment */
				/* n.b.: The wanted size is doubled in Linux in net/sore/sock.c */
				if (!i && curr_rcvbuf_size < rcvbuf_size * 2)
					fprintf(stderr, "The socket receive buffer size was "
						"adjusted due to /proc/sys/net/core/rmem_max.\n");
			}
		}

		if (timestamp || log || logfrmt) {
			if (hwtimestamp) {
				const int timestamping_flags = (SOF_TIMESTAMPING_SOFTWARE |
								SOF_TIMESTAMPING_RX_SOFTWARE |
								SOF_TIMESTAMPING_RAW_HARDWARE);

				if (setsockopt(obj->s, SOL_SOCKET, SO_TIMESTAMPING,
					       &timestamping_flags, sizeof(timestamping_flags)) < 0) {
					perror("setsockopt SO_TIMESTAMPING is not supported by your Linux kernel");
					return 1;
				}
			} else {
				const int timestamp_on = 1;

				if (setsockopt(obj->s, SOL_SOCKET, SO_TIMESTAMP,
					       &timestamp_on, sizeof(timestamp_on)) < 0) {
					perror("setsockopt SO_TIMESTAMP");
					return 1;
				}
			}
		}

		if (dropmonitor) {
			const int dropmonitor_on = 1;

			if (setsockopt(obj->s, SOL_SOCKET, SO_RXQ_OVFL,
				       &dropmonitor_on, sizeof(dropmonitor_on)) < 0) {
				perror("setsockopt SO_RXQ_OVFL not supported by your Linux Kernel");
				return 1;
			}
		}

		if (bind(obj->s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
			perror("bind");
			return 1;
		}
	}

	if (log) {
		if (!logname) {
			time_t currtime;
			struct tm now;

			if (time(&currtime) == (time_t)-1) {
				perror("time");
				return 1;
			}

			localtime_r(&currtime, &now);

			snprintf(fname, sizeof(fname), "candump-%04d-%02d-%02d_%02d%02d%02d.log",
				now.tm_year + 1900,
				now.tm_mon + 1,
				now.tm_mday,
				now.tm_hour,
				now.tm_min,
				now.tm_sec);

			logname = fname;
		}

		if (silent != SILENT_ON)
			fprintf(stderr, "Warning: Console output active while logging!\n");

		fprintf(stderr, "Enabling Logfile '%s'\n", logname);

		logfile = fopen(logname, "w");
		if (!logfile) {
			perror("logfile");
			return 1;
		}
	}

	/* these settings are static and can be held out of the hot path */
	iov.iov_base = &cu;
	msg.msg_name = &addr;
	msg.msg_iov = &iov;
	msg.msg_iovlen = 1;
	msg.msg_control = &ctrlmsg;

	while (running) {
		num_events = epoll_wait(fd_epoll, events_pending, currmax, timeout_ms);
		if (num_events == -1) {
			if (errno != EINTR)
				running = 0;
			continue;
		}

		/* handle timeout */
		if (!num_events && timeout_ms >= 0) {
			running = 0;
			continue;
		}

		for (i = 0; i < num_events; i++) { /* check waiting CAN RAW sockets */
			struct if_info *obj = events_pending[i].data.ptr;
			int idx;
			char *extra_info = "";

			/* these settings may be modified by recvmsg() */
			iov.iov_len = sizeof(cu);
			msg.msg_namelen = sizeof(addr);
			msg.msg_controllen = sizeof(ctrlmsg);
			msg.msg_flags = 0;

			nbytes = recvmsg(obj->s, &msg, 0);
			idx = idx2dindex(addr.can_ifindex, obj->s);

			if (nbytes < 0) {
				if ((errno == ENETDOWN) && !down_causes_exit) {
					fprintf(stderr, "%s: interface down\n", devname[idx]);
					continue;
				}
				perror("read");
				return 1;
			}

			/* mark dual-use struct canfd_frame */
			if (nbytes < (int)CANXL_HDR_SIZE + CANXL_MIN_DLEN) {
				fprintf(stderr, "read: no CAN frame\n");
				return 1;
			}

			if (cu.xl.flags & CANXL_XLF) {
				if (nbytes != (int)CANXL_HDR_SIZE + cu.xl.len) {
					printf("nbytes = %d\n", nbytes);
					fprintf(stderr, "read: no CAN XL frame\n");
					return 1;
				}
			} else {
				if (nbytes == CAN_MTU)
					cu.fd.flags = 0;
				else if (nbytes == CANFD_MTU)
					cu.fd.flags |= CANFD_FDF;
				else {
					fprintf(stderr, "read: incomplete CAN CC/FD frame\n");
					return 1;
				}
			}

			if (count && (--count == 0))
				running = 0;

			for (cmsg = CMSG_FIRSTHDR(&msg);
			     cmsg && (cmsg->cmsg_level == SOL_SOCKET);
			     cmsg = CMSG_NXTHDR(&msg,cmsg)) {
				if (cmsg->cmsg_type == SO_TIMESTAMP) {
					memcpy(&tv, CMSG_DATA(cmsg), sizeof(tv));
				} else if (cmsg->cmsg_type == SO_TIMESTAMPING) {
					struct timespec *stamp = (struct timespec *)CMSG_DATA(cmsg);

					/*
					 * stamp[0] is the software timestamp
					 * stamp[1] is deprecated
					 * stamp[2] is the raw hardware timestamp
					 * See chapter 2.1.2 Receive timestamps in
					 * linux/Documentation/networking/timestamping.txt
					 */
					tv.tv_sec = stamp[2].tv_sec;
					tv.tv_usec = stamp[2].tv_nsec / 1000;
				} else if (cmsg->cmsg_type == SO_RXQ_OVFL) {
					memcpy(&obj->dropcnt, CMSG_DATA(cmsg), sizeof(__u32));
				}
			}

			/* check for (unlikely) dropped frames on this specific socket */
			if (obj->dropcnt != obj->last_dropcnt) {
				__u32 frames = obj->dropcnt - obj->last_dropcnt;

				if (silent != SILENT_ON)
					printf("DROPCOUNT: dropped %u CAN frame%s on '%s' socket (total drops %u)\n",
					       frames, (frames > 1)?"s":"", devname[idx], obj->dropcnt);

				if (log)
					fprintf(logfile, "DROPCOUNT: dropped %u CAN frame%s on '%s' socket (total drops %u)\n",
						frames, (frames > 1)?"s":"", devname[idx], obj->dropcnt);

				obj->last_dropcnt = obj->dropcnt;
			}

			/* once we detected a EFF frame indent SFF frames accordingly */
			if (cu.fd.can_id & CAN_EFF_FLAG)
				view |= CANLIB_VIEW_INDENT_SFF;

			if (extra_msg_info) {
				if (msg.msg_flags & MSG_DONTROUTE)
					extra_info = " T";
				else
					extra_info = " R";
			}

			/* build common log format output */
			if ((log) || ((logfrmt) && (silent == SILENT_OFF))) {

				alen = sprint_timestamp(afrbuf, logtimestamp,
							  &tv, &last_tv);

				alen += sprintf(afrbuf + alen, "%*s ",
						  max_devname_len, devname[idx]);

				alen += snprintf_canframe(afrbuf + alen, sizeof(afrbuf) - alen, &cu, 0);
			}

			/* write CAN frame in log file style to logfile */
			if (log)
				fprintf(logfile, "%s%s\n", afrbuf, extra_info);

			/* print CAN frame in log file style to stdout */
			if ((logfrmt) && (silent == SILENT_OFF)) {
				printf("%s%s\n", afrbuf, extra_info);
				goto out_fflush; /* no other output to stdout */
			}

			/* print only animation */
			if (silent != SILENT_OFF) {
				if (silent == SILENT_ANI) {
					printf("%c\b", anichar[silentani %= MAXANI]);
					silentani++;
				}
				goto out_fflush; /* no other output to stdout */
			}

			/* print (colored) long CAN frame style to stdout */
			alen = sprintf(afrbuf, " %s", (color > 2) ? col_on[idx % MAXCOL] : "");
			alen += sprint_timestamp(afrbuf + alen, timestamp, &tv, &last_tv);
			alen += sprintf(afrbuf + alen, " %s%*s",
					  (color && (color < 3)) ? col_on[idx % MAXCOL] : "",
					  max_devname_len, devname[idx]);

			if (extra_msg_info) {
				if (msg.msg_flags & MSG_DONTROUTE)
					alen += sprintf(afrbuf + alen, "  TX %s",
							  extra_m_info[cu.fd.flags & 3]);
				else
					alen += sprintf(afrbuf + alen, "  RX %s",
							  extra_m_info[cu.fd.flags & 3]);
			}

			alen += sprintf(afrbuf + alen, "%s  ", (color == 1) ? col_off : "");
			alen += snprintf_long_canframe(afrbuf + alen, sizeof(afrbuf) - alen, &cu, view);

			if ((view & CANLIB_VIEW_ERROR) && (cu.fd.can_id & CAN_ERR_FLAG)) {
				alen += sprintf(afrbuf + alen, "\n\t");
				alen += snprintf_can_error_frame(afrbuf + alen,
								 sizeof(afrbuf) - alen,
								 &cu.fd, "\n\t");
			}

			printf("%s%s\n", afrbuf, (color > 1) ? col_off : "");
out_fflush:
			fflush(stdout);
		}
	}

	for (i = 0; i < currmax; i++)
		close(sock_info[i].s);

	close(fd_epoll);

	if (log)
		fclose(logfile);

	if (signal_num)
		return 128 + signal_num;

	return 0;
}